

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_connect_to_string
                   (Curl_easy *data,connectdata *conn,char *conn_to_host,char **host_result,
                   int *port_result)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  bool local_79;
  long port_to_match;
  char *endp;
  char *ptr_next;
  char *hostname_to_match;
  size_t hostname_to_match_len;
  _Bool port_match;
  char *pcStack_48;
  _Bool host_match;
  char *ptr;
  int *piStack_38;
  CURLcode result;
  int *port_result_local;
  char **host_result_local;
  char *conn_to_host_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  ptr._4_4_ = CURLE_OK;
  hostname_to_match_len._7_1_ = 0;
  hostname_to_match_len._6_1_ = 0;
  *host_result = (char *)0x0;
  *port_result = -1;
  piStack_38 = port_result;
  port_result_local = (int *)host_result;
  host_result_local = (char **)conn_to_host;
  conn_to_host_local = (char *)conn;
  conn_local = (connectdata *)data;
  if (*conn_to_host == ':') {
    hostname_to_match_len._7_1_ = true;
    pcStack_48 = conn_to_host + 1;
  }
  else {
    pcVar4 = "";
    if (((ulong)conn->bits >> 10 & 1) != 0) {
      pcVar4 = "[";
    }
    pcVar3 = "";
    if (((ulong)conn->bits >> 10 & 1) != 0) {
      pcVar3 = "]";
    }
    pcStack_48 = conn_to_host;
    ptr_next = curl_maprintf("%s%s%s",pcVar4,(conn->host).name,pcVar3);
    if (ptr_next == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    hostname_to_match = (char *)strlen(ptr_next);
    iVar1 = curl_strnequal(pcStack_48,ptr_next,(size_t)hostname_to_match);
    hostname_to_match_len._7_1_ = iVar1 != 0;
    (*Curl_cfree)(ptr_next);
    local_79 = false;
    if ((hostname_to_match_len._7_1_ & 1) != 0) {
      local_79 = hostname_to_match[(long)pcStack_48] == ':';
    }
    hostname_to_match_len._7_1_ = local_79;
    pcStack_48 = hostname_to_match + (long)pcStack_48 + 1;
  }
  if ((bool)hostname_to_match_len._7_1_ != false) {
    if (*pcStack_48 == ':') {
      hostname_to_match_len._6_1_ = 1;
      pcStack_48 = pcStack_48 + 1;
    }
    else {
      endp = strchr(pcStack_48,0x3a);
      if (endp != (char *)0x0) {
        port_to_match = 0;
        lVar2 = strtol(pcStack_48,(char **)&port_to_match,10);
        if (((char *)port_to_match == endp) && (lVar2 == *(int *)(conn_to_host_local + 0x570))) {
          hostname_to_match_len._6_1_ = 1;
          pcStack_48 = endp + 1;
        }
      }
    }
  }
  if (((hostname_to_match_len._7_1_ & 1) != 0) && ((hostname_to_match_len._6_1_ & 1) != 0)) {
    ptr._4_4_ = parse_connect_to_host_port
                          ((Curl_easy *)conn_local,pcStack_48,(char **)port_result_local,piStack_38)
    ;
  }
  return ptr._4_4_;
}

Assistant:

static CURLcode parse_connect_to_string(struct Curl_easy *data,
                                        struct connectdata *conn,
                                        const char *conn_to_host,
                                        char **host_result,
                                        int *port_result)
{
  CURLcode result = CURLE_OK;
  const char *ptr = conn_to_host;
  bool host_match = FALSE;
  bool port_match = FALSE;

  *host_result = NULL;
  *port_result = -1;

  if(*ptr == ':') {
    /* an empty hostname always matches */
    host_match = TRUE;
    ptr++;
  }
  else {
    /* check whether the URL's hostname matches */
    size_t hostname_to_match_len;
    char *hostname_to_match = aprintf("%s%s%s",
                                      conn->bits.ipv6_ip ? "[" : "",
                                      conn->host.name,
                                      conn->bits.ipv6_ip ? "]" : "");
    if(!hostname_to_match)
      return CURLE_OUT_OF_MEMORY;
    hostname_to_match_len = strlen(hostname_to_match);
    host_match = strncasecompare(ptr, hostname_to_match,
                                 hostname_to_match_len);
    free(hostname_to_match);
    ptr += hostname_to_match_len;

    host_match = host_match && *ptr == ':';
    ptr++;
  }

  if(host_match) {
    if(*ptr == ':') {
      /* an empty port always matches */
      port_match = TRUE;
      ptr++;
    }
    else {
      /* check whether the URL's port matches */
      char *ptr_next = strchr(ptr, ':');
      if(ptr_next) {
        char *endp = NULL;
        long port_to_match = strtol(ptr, &endp, 10);
        if((endp == ptr_next) && (port_to_match == conn->remote_port)) {
          port_match = TRUE;
          ptr = ptr_next + 1;
        }
      }
    }
  }

  if(host_match && port_match) {
    /* parse the hostname and port to connect to */
    result = parse_connect_to_host_port(data, ptr, host_result, port_result);
  }

  return result;
}